

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

int Saig_ManBmcCreateCnf(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  long lVar8;
  Aig_Obj_t *pAVar9;
  long lVar10;
  
  iVar4 = Saig_ManBmcRunTerSim_rec(p,pObj,iFrame);
  if (iVar4 == 3) {
    p_00 = p->vVisited;
    iVar4 = p_00->nSize;
    if (0 < (long)iVar4) {
      pVVar6 = p_00->pArray;
      lVar7 = 0;
      do {
        *(undefined4 *)((long)&pVVar6->nSize + lVar7) = 0;
        lVar7 = lVar7 + 0x10;
      } while ((long)iVar4 * 0x10 != lVar7);
    }
    p_00->nSize = 0;
    pVVar6 = Vec_WecPushLevel(p_00);
    Vec_IntPush(pVVar6,pObj->Id);
    iVar4 = iFrame;
    if (-1 < iFrame) {
      do {
        Aig_ManIncrementTravId(p->pAig);
        pVVar6 = Vec_WecPushLevel(p->vVisited);
        lVar7 = (long)p->vVisited->nSize;
        if (lVar7 < 2) goto LAB_00566c91;
        pVVar1 = p->vVisited->pArray;
        if (0 < pVVar1[lVar7 + -2].nSize) {
          lVar10 = 0;
          do {
            pVVar2 = p->pAig->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              pAVar9 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar5 = pVVar1[lVar7 + -2].pArray[lVar10];
              if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) goto LAB_00566c72;
              pAVar9 = (Aig_Obj_t *)pVVar2->pArray[uVar5];
            }
            Saig_ManBmcCreateCnf_iter(p,pAVar9,iVar4,pVVar6);
            lVar10 = lVar10 + 1;
          } while (lVar10 < pVVar1[lVar7 + -2].nSize);
        }
      } while ((pVVar6->nSize != 0) && (bVar3 = 0 < iVar4, iVar4 = iVar4 + -1, bVar3));
    }
    lVar7 = (long)p->vVisited->nSize;
    if (0 < lVar7) {
      do {
        if (p->vVisited->nSize < lVar7) {
LAB_00566c91:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        lVar10 = lVar7 + -1;
        pVVar6 = p->vVisited->pArray;
        if (0 < pVVar6[lVar10].nSize) {
          lVar8 = 0;
          do {
            pVVar2 = p->pAig->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              pAVar9 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar5 = pVVar6[lVar10].pArray[lVar8];
              if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) {
LAB_00566c72:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pAVar9 = (Aig_Obj_t *)pVVar2->pArray[uVar5];
            }
            Saig_ManBmcCreateCnf_rec(p,pAVar9,iFrame - (int)lVar10);
            lVar8 = lVar8 + 1;
          } while (lVar8 < pVVar6[lVar10].nSize);
        }
        bVar3 = 1 < lVar7;
        lVar7 = lVar10;
      } while (bVar3);
    }
    uVar5 = Saig_ManBmcLiteral(p,pObj,iFrame);
    if (p->pSat2 == (solver_t *)0x0) {
      if (p->pSat3 == (bmcg_sat_solver *)0x0) {
        sat_solver_setnvars(p->pSat,p->nSatVars);
      }
      else {
        iVar4 = bmcg_sat_solver_varnum(p->pSat3);
        if (iVar4 < p->nSatVars) {
          do {
            bmcg_sat_solver_addvar(p->pSat3);
            iVar4 = iVar4 + 1;
          } while (iVar4 < p->nSatVars);
        }
      }
    }
    else {
      satoko_setnvars(p->pSat2,p->nSatVars);
    }
  }
  else {
    uVar5 = (uint)(iVar4 == 2);
  }
  return uVar5;
}

Assistant:

int Saig_ManBmcCreateCnf( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    Vec_Int_t * vVisit, * vVisit2;
    Aig_Obj_t * pTemp;
    int Lit, f, i;
    // perform ternary simulation
    int Value = Saig_ManBmcRunTerSim_rec( p, pObj, iFrame );
    if ( Value != SAIG_TER_UND )
        return (int)(Value == SAIG_TER_ONE);
    // construct CNF if value is ternary
//    Lit = Saig_ManBmcCreateCnf_rec( p, pObj, iFrame );
    Vec_WecClear( p->vVisited );
    vVisit = Vec_WecPushLevel( p->vVisited );
    Vec_IntPush( vVisit, Aig_ObjId(pObj) );
    for ( f = iFrame; f >= 0; f-- )
    {
        Aig_ManIncrementTravId( p->pAig );
        vVisit2 = Vec_WecPushLevel( p->vVisited );
        vVisit = Vec_WecEntry( p->vVisited, Vec_WecSize(p->vVisited)-2 );
        Aig_ManForEachObjVec( vVisit, p->pAig, pTemp, i )
            Saig_ManBmcCreateCnf_iter( p, pTemp, f, vVisit2 );
        if ( Vec_IntSize(vVisit2) == 0 )
            break;
    }
    Vec_WecForEachLevelReverse( p->vVisited, vVisit, f )
        Aig_ManForEachObjVec( vVisit, p->pAig, pTemp, i )
            Saig_ManBmcCreateCnf_rec( p, pTemp, iFrame-f );
    Lit = Saig_ManBmcLiteral( p, pObj, iFrame );
    // extend the SAT solver
    if ( p->pSat2 )
        satoko_setnvars( p->pSat2, p->nSatVars );
    else if ( p->pSat3 )
    {
        for ( i = bmcg_sat_solver_varnum(p->pSat3); i < p->nSatVars; i++ )
            bmcg_sat_solver_addvar( p->pSat3 );
    }
    else
        sat_solver_setnvars( p->pSat, p->nSatVars );
    return Lit;
}